

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVarLengthArray<QDirSortItem,_64LL>::~QVarLengthArray(QVarLengthArray<QDirSortItem,_64LL> *this)

{
  QDirSortItem *pQVar1;
  QVLABaseBase *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  QDirSortItem *in_stack_ffffffffffffffe0;
  
  QVLABase<QDirSortItem>::data((QVLABase<QDirSortItem> *)in_RDI);
  QVLABaseBase::size(in_RDI);
  std::destroy_n<QDirSortItem*,long_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pQVar1 = QVLABase<QDirSortItem>::data((QVLABase<QDirSortItem> *)in_RDI);
  if (pQVar1 != (QDirSortItem *)(in_RDI + 1)) {
    pQVar1 = QVLABase<QDirSortItem>::data((QVLABase<QDirSortItem> *)in_RDI);
    QVLABaseBase::capacity(in_RDI);
    QtPrivate::sizedFree(pQVar1,in_stack_ffffffffffffffd8,0x28a53d);
  }
  return;
}

Assistant:

inline ~QVarLengthArray()
    {
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(data(), size());
        if (data() != reinterpret_cast<T *>(this->array))
            QtPrivate::sizedFree(data(), capacity(), sizeof(T));
    }